

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

bool __thiscall clickhouse::Client::Impl::SendHello(Impl *this)

{
  CodedOutputStream *this_00;
  uint64_t value;
  long *plVar1;
  long *plVar2;
  long *local_60;
  int local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  this_00 = &this->output_;
  CodedOutputStream::WriteVarint64(this_00,0);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"ClickHouse","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_40);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
    local_60 = (long *)*plVar1;
  }
  value = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  CodedOutputStream::WriteVarint64(this_00,value);
  local_58 = (int)value;
  CodedOutputStream::WriteRaw(this_00,local_60,local_58);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  CodedOutputStream::WriteVarint64(this_00,1);
  CodedOutputStream::WriteVarint64(this_00,1);
  CodedOutputStream::WriteVarint64(this_00,0xd481);
  CodedOutputStream::WriteVarint64(this_00,(this->options_).default_database._M_string_length);
  CodedOutputStream::WriteRaw
            (this_00,(this->options_).default_database._M_dataplus._M_p,
             (int)(this->options_).default_database._M_string_length);
  CodedOutputStream::WriteVarint64(this_00,(this->options_).user._M_string_length);
  CodedOutputStream::WriteRaw
            (this_00,(this->options_).user._M_dataplus._M_p,
             (int)(this->options_).user._M_string_length);
  CodedOutputStream::WriteVarint64(this_00,(this->options_).password._M_string_length);
  CodedOutputStream::WriteRaw
            (this_00,(this->options_).password._M_dataplus._M_p,
             (int)(this->options_).password._M_string_length);
  CodedOutputStream::Flush(this_00);
  return true;
}

Assistant:

bool Client::Impl::SendHello() {
    WireFormat::WriteUInt64(&output_, ClientCodes::Hello);
    WireFormat::WriteString(&output_, std::string(DBMS_NAME) + " client");
    WireFormat::WriteUInt64(&output_, DBMS_VERSION_MAJOR);
    WireFormat::WriteUInt64(&output_, DBMS_VERSION_MINOR);
    WireFormat::WriteUInt64(&output_, REVISION);
    WireFormat::WriteString(&output_, options_.default_database);
    WireFormat::WriteString(&output_, options_.user);
    WireFormat::WriteString(&output_, options_.password);

    output_.Flush();

    return true;
}